

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr * __thiscall c4::yml::Tree::val(Tree *this,size_t node)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Location *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffc8;
  Tree *in_stack_ffffffffffffffd0;
  undefined8 uVar4;
  
  uVar4 = in_RDI;
  pNVar3 = _p(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (((pNVar3->m_type).type & VAL) == NOTYPE) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78);
    loc.super_LineCol.line = in_RSI;
    loc.super_LineCol.offset = in_RDI;
    loc.super_LineCol.col = uVar4;
    loc.name.str = (char *)pNVar3;
    loc.name.len = unaff_retaddr;
    error<28ul>((char (*) [28])in_stack_ffffffffffffffd0,loc);
  }
  pNVar3 = _p(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return &(pNVar3->m_val).scalar;
}

Assistant:

csubstr    const& val       (size_t node) const { RYML_ASSERT(has_val(node)); return _p(node)->m_val.scalar; }